

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void percent_rankValueFunc(sqlite3_context *pCtx)

{
  long *plVar1;
  double val;
  
  if ((pCtx->pMem->flags & 0x2000) == 0) {
    plVar1 = (long *)createAggContext(pCtx,0x18);
  }
  else {
    plVar1 = (long *)pCtx->pMem->z;
  }
  if (plVar1 != (long *)0x0) {
    *plVar1 = plVar1[1];
    if (plVar1[2] < 2) {
      val = 0.0;
    }
    else {
      val = (double)plVar1[1] / (double)(plVar1[2] + -1);
    }
    sqlite3VdbeMemSetDouble(pCtx->pOut,val);
    return;
  }
  return;
}

Assistant:

static void percent_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    p->nValue = p->nStep;
    if( p->nTotal>1 ){
      double r = (double)p->nValue / (double)(p->nTotal-1);
      sqlite3_result_double(pCtx, r);
    }else{
      sqlite3_result_double(pCtx, 0.0);
    }
  }
}